

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::subtype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  HeapTypeT *pHVar4;
  basic_string_view<char,_std::char_traits<char>_> expected;
  HeapTypeT super_00;
  Ok local_1c1;
  Err local_1c0;
  Err *local_1a0;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  string local_168;
  Err local_148;
  Err local_128;
  Err *local_108;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Err local_c0;
  Err *local_a0;
  Err *err;
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  undefined1 local_60 [8];
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> super;
  ParseTypeDefsCtx *ctx_local;
  
  expected = sv("sub",3);
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar3) {
    sharecomptype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Ok> *)&err_2,ctx);
    local_1a0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
    bVar3 = local_1a0 != (Err *)0x0;
    if (bVar3) {
      wasm::Err::Err(&local_1c0,local_1a0);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1c0);
      wasm::Err::~Err(&local_1c0);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
    if (bVar3) {
      return __return_storage_ptr__;
    }
    goto LAB_023f20a7;
  }
  join_0x00000010_0x00000000_ = sv("final",5);
  bVar3 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
  if (!bVar3) {
    ParseTypeDefsCtx::setOpen(ctx);
  }
  maybeTypeidx<wasm::WATParser::ParseTypeDefsCtx>
            ((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
              *)local_60,ctx);
  bVar3 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_60);
  if (bVar3) {
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
    MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                 *)&err,(MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                         *)local_60);
    local_a0 = MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
               ::getErr((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                         *)&err);
    bVar3 = local_a0 != (Err *)0x0;
    if (bVar3) {
      wasm::Err::Err(&local_c0,local_a0);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
      wasm::Err::~Err(&local_c0);
    }
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
    ~MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)&err);
    if (!bVar3) {
      pHVar4 = MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
               ::operator*((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                            *)local_60);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = (pHVar4->type).id;
      uVar1 = pHVar4->type;
      uVar2 = pHVar4->exactness;
      super_00.exactness = uVar2;
      super_00.type.id = uVar1;
      super_00._12_4_ = 0;
      ParseTypeDefsCtx::setSupertype(ctx,super_00);
      goto LAB_023f1da4;
    }
  }
  else {
LAB_023f1da4:
    bVar3 = false;
  }
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
  ~MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)local_60);
  if (bVar3) {
    return __return_storage_ptr__;
  }
  sharecomptype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Ok> *)&err_1,ctx);
  local_108 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
  bVar3 = local_108 != (Err *)0x0;
  if (bVar3) {
    wasm::Err::Err(&local_128,local_108);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_128);
    wasm::Err::~Err(&local_128);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
  if (bVar3) {
    return __return_storage_ptr__;
  }
  bVar3 = Lexer::takeRParen(&ctx->in);
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"expected end of subtype definition",
               (allocator<char> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    Lexer::err(&local_148,&ctx->in,&local_168);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_148);
    wasm::Err::~Err(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    return __return_storage_ptr__;
  }
LAB_023f20a7:
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1c1);
  return __return_storage_ptr__;
}

Assistant:

Result<> subtype(Ctx& ctx) {
  if (ctx.in.takeSExprStart("sub"sv)) {
    if (!ctx.in.takeKeyword("final"sv)) {
      ctx.setOpen();
    }
    if (auto super = maybeTypeidx(ctx)) {
      CHECK_ERR(super);
      ctx.setSupertype(*super);
    }

    CHECK_ERR(sharecomptype(ctx));

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of subtype definition");
    }
  } else {
    CHECK_ERR(sharecomptype(ctx));
  }
  return Ok{};
}